

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetFilteredSignal
               (double boundary_f0,int fft_size,double fs,fft_complex *y_spectrum,int y_length,
               double *filtered_signal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  ulong uVar4;
  long in_RCX;
  int in_EDX;
  double *in_RSI;
  int in_EDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  int i_3;
  int index_bias;
  fft_plan inverseFFT;
  int i_2;
  double tmp;
  fft_plan forwardFFT;
  fft_complex *band_pass_filter_spectrum;
  int i_1;
  int i;
  double *band_pass_filter;
  int filter_length_half;
  undefined8 in_stack_fffffffffffffd98;
  fft_complex *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int iVar5;
  undefined8 in_stack_fffffffffffffde8;
  double *in_stack_fffffffffffffdf0;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [40];
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int iVar6;
  undefined4 in_stack_fffffffffffffe7c;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  double *in_stack_fffffffffffffeb0;
  undefined1 local_138 [76];
  int local_ec;
  double local_e8;
  undefined1 local_e0 [20];
  uint uStack_cc;
  double *pdStack_c8;
  fft_complex *local_c0;
  undefined8 uStack_b8;
  int iStack_b4;
  undefined1 local_98 [72];
  double *local_50;
  int local_48;
  int local_44;
  void *local_40;
  int local_34;
  long local_30;
  int local_24;
  double *local_20;
  double local_18;
  int local_c;
  double local_8;
  
  local_8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_30 = in_RCX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_18 = in_XMM1_Qa;
  local_c = in_EDI;
  local_34 = matlab_round((in_XMM1_Qa / local_8) * 2.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_c;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_40 = operator_new__(uVar4);
  NuttallWindow(in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8);
  for (local_44 = -local_34; local_44 <= local_34; local_44 = local_44 + 1) {
    dVar3 = cos((local_8 * 6.283185307179586 * (double)local_44) / local_18);
    *(double *)((long)local_40 + (long)(local_44 + local_34) * 8) =
         dVar3 * *(double *)((long)local_40 + (long)(local_44 + local_34) * 8);
  }
  local_48 = local_34 * 2;
  while (local_48 = local_48 + 1, local_48 < local_c) {
    *(undefined8 *)((long)local_40 + (long)local_48 * 8) = 0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_c;
  uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_50 = (double *)operator_new__(uVar4);
  fft_plan_dft_r2c_1d(in_stack_fffffffffffffdb4,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                      (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  memcpy(local_e0,local_98,0x48);
  p_01.flags = in_stack_fffffffffffffe78;
  p_01.n = (int)in_stack_fffffffffffffe70;
  p_01.sign = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  p_01._12_4_ = in_stack_fffffffffffffe7c;
  p_01.c_in = (fft_complex *)in_stack_fffffffffffffe80;
  p_01.in = (double *)in_stack_fffffffffffffe88;
  p_01.c_out = (fft_complex *)in_stack_fffffffffffffe90;
  p_01.out = (double *)in_stack_fffffffffffffe98;
  p_01.input = (double *)in_stack_fffffffffffffea0;
  p_01.ip = (int *)in_stack_fffffffffffffea8;
  p_01.w = in_stack_fffffffffffffeb0;
  fft_execute(p_01);
  local_e8 = *local_20 * *local_50 + -(local_20[1] * local_50[1]);
  local_50[1] = *local_20 * local_50[1] + local_20[1] * *local_50;
  *local_50 = local_e8;
  for (local_ec = 1; local_ec <= local_c / 2; local_ec = local_ec + 1) {
    local_e8 = local_20[(long)local_ec * 2] * local_50[(long)local_ec * 2] +
               -(local_20[(long)local_ec * 2 + 1] * local_50[(long)local_ec * 2 + 1]);
    local_50[(long)local_ec * 2 + 1] =
         local_20[(long)local_ec * 2] * local_50[(long)local_ec * 2 + 1] +
         local_20[(long)local_ec * 2 + 1] * local_50[(long)local_ec * 2];
    local_50[(long)local_ec * 2] = local_e8;
    local_50[(long)((local_c - local_ec) + -1) * 2] = local_50[(long)local_ec * 2];
    local_50[(long)((local_c - local_ec) + -1) * 2 + 1] = local_50[(long)local_ec * 2 + 1];
  }
  iVar5 = local_ec;
  fft_plan_dft_c2r_1d(iStack_b4,local_c0,pdStack_c8,uStack_cc);
  memcpy(&stack0xfffffffffffffe80,local_138,0x48);
  p_02.flags = in_stack_fffffffffffffe78;
  p_02.n = (int)in_stack_fffffffffffffe70;
  p_02.sign = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  p_02._12_4_ = in_stack_fffffffffffffe7c;
  p_02.c_in = (fft_complex *)in_stack_fffffffffffffe80;
  p_02.in = (double *)in_stack_fffffffffffffe88;
  p_02.c_out = (fft_complex *)in_stack_fffffffffffffe90;
  p_02.out = (double *)in_stack_fffffffffffffe98;
  p_02.input = (double *)in_stack_fffffffffffffea0;
  p_02.ip = (int *)in_stack_fffffffffffffea8;
  p_02.w = in_stack_fffffffffffffeb0;
  fft_execute(p_02);
  for (iVar6 = 0; iVar6 < local_24; iVar6 = iVar6 + 1) {
    *(undefined8 *)(local_30 + (long)iVar6 * 8) =
         *(undefined8 *)(local_30 + (long)(iVar6 + local_34 + 1) * 8);
  }
  memcpy(local_1d0,local_138,0x48);
  p._8_8_ = local_1a0;
  p.n = (undefined4)uStack_1a8;
  p.sign = uStack_1a8._4_4_;
  p.c_in = (fft_complex *)uStack_198;
  p.in = (double *)in_stack_fffffffffffffe70;
  p.c_out = (fft_complex *)in_stack_fffffffffffffdd0;
  p.out = (double *)in_stack_fffffffffffffdd8;
  p.input._0_4_ = in_stack_fffffffffffffde0;
  p.input._4_4_ = iVar5;
  p.ip = (int *)in_stack_fffffffffffffde8;
  p.w = in_stack_fffffffffffffdf0;
  fft_destroy_plan(p);
  memcpy(&stack0xfffffffffffffde8,local_98,0x48);
  p_00._8_8_ = local_1e8;
  p_00._0_8_ = uStack_1f0;
  p_00.c_in = (fft_complex *)uStack_1e0;
  p_00.in = (double *)local_1d8;
  p_00.c_out = (fft_complex *)in_stack_fffffffffffffdd0;
  p_00.out = (double *)in_stack_fffffffffffffdd8;
  p_00.input._0_4_ = in_stack_fffffffffffffde0;
  p_00.input._4_4_ = iVar5;
  p_00.ip = (int *)in_stack_fffffffffffffde8;
  p_00.w = in_stack_fffffffffffffdf0;
  fft_destroy_plan(p_00);
  if (local_50 != (double *)0x0) {
    operator_delete__(local_50);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return;
}

Assistant:

static void GetFilteredSignal(double boundary_f0, int fft_size, double fs,
    const fft_complex *y_spectrum, int y_length, double *filtered_signal) {
  int filter_length_half = matlab_round(fs / boundary_f0 * 2.0);
  double *band_pass_filter = new double[fft_size];
  NuttallWindow(filter_length_half * 2 + 1, band_pass_filter);
  for (int i = -filter_length_half; i <= filter_length_half; ++i)
    band_pass_filter[i + filter_length_half] *=
      cos(2 * world::kPi * boundary_f0 * i / fs);
  for (int i = filter_length_half * 2 + 1; i < fft_size; ++i)
    band_pass_filter[i] = 0.0;

  fft_complex *band_pass_filter_spectrum = new fft_complex[fft_size];
  fft_plan forwardFFT = fft_plan_dft_r2c_1d(fft_size, band_pass_filter,
    band_pass_filter_spectrum, FFT_ESTIMATE);
  fft_execute(forwardFFT);

  // Convolution
  double tmp = y_spectrum[0][0] * band_pass_filter_spectrum[0][0] -
    y_spectrum[0][1] * band_pass_filter_spectrum[0][1];
  band_pass_filter_spectrum[0][1] =
    y_spectrum[0][0] * band_pass_filter_spectrum[0][1] +
    y_spectrum[0][1] * band_pass_filter_spectrum[0][0];
  band_pass_filter_spectrum[0][0] = tmp;
  for (int i = 1; i <= fft_size / 2; ++i) {
    tmp = y_spectrum[i][0] * band_pass_filter_spectrum[i][0] -
      y_spectrum[i][1] * band_pass_filter_spectrum[i][1];
    band_pass_filter_spectrum[i][1] =
      y_spectrum[i][0] * band_pass_filter_spectrum[i][1] +
      y_spectrum[i][1] * band_pass_filter_spectrum[i][0];
    band_pass_filter_spectrum[i][0] = tmp;
    band_pass_filter_spectrum[fft_size - i - 1][0] =
      band_pass_filter_spectrum[i][0];
    band_pass_filter_spectrum[fft_size - i - 1][1] =
      band_pass_filter_spectrum[i][1];
  }

  fft_plan inverseFFT = fft_plan_dft_c2r_1d(fft_size,
    band_pass_filter_spectrum, filtered_signal, FFT_ESTIMATE);
  fft_execute(inverseFFT);

  // Compensation of the delay.
  int index_bias = filter_length_half + 1;
  for (int i = 0; i < y_length; ++i)
    filtered_signal[i] = filtered_signal[i + index_bias];

  fft_destroy_plan(inverseFFT);
  fft_destroy_plan(forwardFFT);
  delete[] band_pass_filter_spectrum;
  delete[] band_pass_filter;
}